

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::TimeBucketFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  LogicalType varargs_04;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  pointer function;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  undefined4 in_stack_fffffffffffff554;
  undefined4 in_stack_fffffffffffff55c;
  FunctionNullHandling in_stack_fffffffffffff568;
  allocator_type local_a91;
  LogicalType local_a88 [3];
  scalar_function_t local_a40;
  scalar_function_t local_a20;
  scalar_function_t local_a00;
  scalar_function_t local_9e0;
  scalar_function_t local_9c0;
  scalar_function_t local_9a0;
  LogicalType local_980;
  vector<duckdb::LogicalType,_true> local_968;
  LogicalType local_950;
  vector<duckdb::LogicalType,_true> local_938;
  LogicalType local_920;
  vector<duckdb::LogicalType,_true> local_908;
  LogicalType local_8f0;
  vector<duckdb::LogicalType,_true> local_8d8;
  LogicalType local_8c0;
  vector<duckdb::LogicalType,_true> local_8a8;
  LogicalType local_890;
  vector<duckdb::LogicalType,_true> local_878;
  LogicalType local_860;
  LogicalType local_848;
  LogicalType local_830;
  LogicalType local_818;
  LogicalType local_800;
  LogicalType local_7e8;
  ScalarFunction local_7d0;
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(local_a88,INTERVAL);
  LogicalType::LogicalType(local_a88 + 1,DATE);
  __l._M_len = 2;
  __l._M_array = local_a88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_878,__l,
             &local_a91);
  LogicalType::LogicalType(&local_890,DATE);
  local_9a0.super__Function_base._M_functor._8_8_ = 0;
  local_9a0.super__Function_base._M_functor._M_unused._M_object = TimeBucketFunction<duckdb::date_t>
  ;
  local_9a0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_9a0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_7e8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_7e8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff554;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff55c;
  ScalarFunction::ScalarFunction
            (&local_208,&local_878,&local_890,&local_9a0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_7e8);
  if (local_9a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_9a0.super__Function_base._M_manager)
              ((_Any_data *)&local_9a0,(_Any_data *)&local_9a0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_890);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_878);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a88[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_a88,INTERVAL);
  LogicalType::LogicalType(local_a88 + 1,TIMESTAMP);
  __l_00._M_len = 2;
  __l_00._M_array = local_a88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_8a8,__l_00,
             &local_a91);
  LogicalType::LogicalType(&local_8c0,TIMESTAMP);
  local_9c0.super__Function_base._M_functor._8_8_ = 0;
  local_9c0.super__Function_base._M_functor._M_unused._M_object =
       TimeBucketFunction<duckdb::timestamp_t>;
  local_9c0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_9c0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_800,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_800;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff554;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff55c;
  ScalarFunction::ScalarFunction
            (&local_330,&local_8a8,&local_8c0,&local_9c0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_800);
  if (local_9c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_9c0.super__Function_base._M_manager)
              ((_Any_data *)&local_9c0,(_Any_data *)&local_9c0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_8c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_8a8);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a88[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_a88,INTERVAL);
  LogicalType::LogicalType(local_a88 + 1,DATE);
  LogicalType::LogicalType(local_a88 + 2,INTERVAL);
  __l_01._M_len = 3;
  __l_01._M_array = local_a88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_8d8,__l_01,
             &local_a91);
  LogicalType::LogicalType(&local_8f0,DATE);
  local_9e0.super__Function_base._M_functor._8_8_ = 0;
  local_9e0.super__Function_base._M_functor._M_unused._M_object =
       TimeBucketOffsetFunction<duckdb::date_t>;
  local_9e0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_9e0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_818,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_818;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff554;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff55c;
  ScalarFunction::ScalarFunction
            (&local_458,&local_8d8,&local_8f0,&local_9e0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_01,CONSISTENT,in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)&local_458.function,(_Any_data *)&local_458.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_818);
  if (local_9e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_9e0.super__Function_base._M_manager)
              ((_Any_data *)&local_9e0,(_Any_data *)&local_9e0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_8f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_8d8);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a88[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_a88,INTERVAL);
  LogicalType::LogicalType(local_a88 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_a88 + 2,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = local_a88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_908,__l_02,
             &local_a91);
  LogicalType::LogicalType(&local_920,TIMESTAMP);
  local_a00.super__Function_base._M_functor._8_8_ = 0;
  local_a00.super__Function_base._M_functor._M_unused._M_object =
       TimeBucketOffsetFunction<duckdb::timestamp_t>;
  local_a00._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a00.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_830,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_830;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff554;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff55c;
  ScalarFunction::ScalarFunction
            (&local_580,&local_908,&local_920,&local_a00,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_02,CONSISTENT,in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  local_580.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)&local_580.function,(_Any_data *)&local_580.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_830);
  if (local_a00.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a00.super__Function_base._M_manager)
              ((_Any_data *)&local_a00,(_Any_data *)&local_a00,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_920);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_908);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a88[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_a88,INTERVAL);
  LogicalType::LogicalType(local_a88 + 1,DATE);
  LogicalType::LogicalType(local_a88 + 2,DATE);
  __l_03._M_len = 3;
  __l_03._M_array = local_a88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_938,__l_03,
             &local_a91);
  LogicalType::LogicalType(&local_950,DATE);
  local_a20.super__Function_base._M_functor._8_8_ = 0;
  local_a20.super__Function_base._M_functor._M_unused._M_object =
       TimeBucketOriginFunction<duckdb::date_t>;
  local_a20._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a20.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_848,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_848;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff554;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff55c;
  ScalarFunction::ScalarFunction
            (&local_6a8,&local_938,&local_950,&local_a20,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_03,CONSISTENT,in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_6a8);
  local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_6a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_6a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_6a8.function,(_Any_data *)&local_6a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_6a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_848);
  if (local_a20.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a20.super__Function_base._M_manager)
              ((_Any_data *)&local_a20,(_Any_data *)&local_a20,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_950);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_938);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a88[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_a88,INTERVAL);
  LogicalType::LogicalType(local_a88 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_a88 + 2,TIMESTAMP);
  __l_04._M_len = 3;
  __l_04._M_array = local_a88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_968,__l_04,
             &local_a91);
  LogicalType::LogicalType(&local_980,TIMESTAMP);
  local_a40.super__Function_base._M_functor._8_8_ = 0;
  local_a40.super__Function_base._M_functor._M_unused._M_object =
       TimeBucketOriginFunction<duckdb::timestamp_t>;
  local_a40._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a40.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_860,INVALID);
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_04._0_8_ = &local_860;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff554;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff55c;
  ScalarFunction::ScalarFunction
            (&local_7d0,&local_968,&local_980,&local_a40,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_04,CONSISTENT,in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_7d0);
  local_7d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_7d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_7d0.function,(_Any_data *)&local_7d0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_7d0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_860);
  if (local_a40.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a40.super__Function_base._M_manager)
              ((_Any_data *)&local_a40,(_Any_data *)&local_a40,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_980);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_968);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a88[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet TimeBucketFun::GetFunctions() {
	ScalarFunctionSet time_bucket;
	time_bucket.AddFunction(
	    ScalarFunction({LogicalType::INTERVAL, LogicalType::DATE}, LogicalType::DATE, TimeBucketFunction<date_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::TIMESTAMP}, LogicalType::TIMESTAMP,
	                                       TimeBucketFunction<timestamp_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::DATE, LogicalType::INTERVAL},
	                                       LogicalType::DATE, TimeBucketOffsetFunction<date_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                       LogicalType::TIMESTAMP, TimeBucketOffsetFunction<timestamp_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::DATE, LogicalType::DATE},
	                                       LogicalType::DATE, TimeBucketOriginFunction<date_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::TIMESTAMP, LogicalType::TIMESTAMP},
	                                       LogicalType::TIMESTAMP, TimeBucketOriginFunction<timestamp_t>));
	for (auto &func : time_bucket.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return time_bucket;
}